

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_grasshopper_cipher.c
# Opt level: O1

int gost_grasshopper_cipher_do_cbc(EVP_CIPHER_CTX *ctx,uchar *out,uchar *in,size_t inl)

{
  uint64_t uVar1;
  uint64_t uVar2;
  int i;
  int iVar3;
  long lVar4;
  grasshopper_w128_t *source;
  long lVar5;
  ulong uVar6;
  grasshopper_w128_t *currentInputBlock;
  grasshopper_w128_t *currentOutputBlock;
  grasshopper_w128_t tmp;
  
  lVar4 = EVP_CIPHER_CTX_get_cipher_data();
  source = (grasshopper_w128_t *)EVP_CIPHER_CTX_iv_noconst(ctx);
  iVar3 = EVP_CIPHER_CTX_is_encrypting(ctx);
  if (0xf < inl) {
    uVar6 = 0;
    do {
      if (iVar3 == 0) {
        uVar1 = *(uint64_t *)in;
        uVar2 = *(uint64_t *)((long)in + 8);
        grasshopper_decrypt_block
                  ((grasshopper_round_keys_t *)(lVar4 + 0xe8),(grasshopper_w128_t *)in,
                   (grasshopper_w128_t *)out,(grasshopper_w128_t *)(lVar4 + 0x188));
        lVar5 = 0;
        do {
          *(ulong *)((long)out + lVar5 * 8) = *(ulong *)((long)out + lVar5 * 8) ^ source->q[lVar5];
          lVar5 = lVar5 + 1;
        } while (lVar5 == 1);
        source->q[0] = uVar1;
        source->q[1] = uVar2;
      }
      else {
        lVar5 = 0;
        do {
          source->q[lVar5] = source->q[lVar5] ^ *(ulong *)((long)in + lVar5 * 8);
          lVar5 = lVar5 + 1;
        } while (lVar5 == 1);
        grasshopper_encrypt_block
                  ((grasshopper_round_keys_t *)(lVar4 + 0x48),source,(grasshopper_w128_t *)out,
                   (grasshopper_w128_t *)(lVar4 + 0x188));
        lVar5 = 0;
        do {
          source->q[lVar5] = *(uint64_t *)((long)out + lVar5 * 8);
          lVar5 = lVar5 + 1;
        } while (lVar5 == 1);
      }
      uVar6 = uVar6 + 1;
      in = (uchar *)((long)in + 0x10);
      out = (uchar *)((long)out + 0x10);
    } while (uVar6 != inl >> 4);
  }
  return 1;
}

Assistant:

static int gost_grasshopper_cipher_do_cbc(EVP_CIPHER_CTX *ctx, unsigned char *out,
                                          const unsigned char *in, size_t inl)
{
    gost_grasshopper_cipher_ctx *c =
        (gost_grasshopper_cipher_ctx *) EVP_CIPHER_CTX_get_cipher_data(ctx);
    unsigned char *iv = EVP_CIPHER_CTX_iv_noconst(ctx);
    bool encrypting = (bool) EVP_CIPHER_CTX_encrypting(ctx);
    const unsigned char *current_in = in;
    unsigned char *current_out = out;
    size_t blocks = inl / GRASSHOPPER_BLOCK_SIZE;
    size_t i;
    grasshopper_w128_t *currentBlock;

    currentBlock = (grasshopper_w128_t *) iv;

    for (i = 0; i < blocks;
         i++, current_in += GRASSHOPPER_BLOCK_SIZE, current_out +=
         GRASSHOPPER_BLOCK_SIZE) {
        grasshopper_w128_t *currentInputBlock = (grasshopper_w128_t *) current_in;
        grasshopper_w128_t *currentOutputBlock = (grasshopper_w128_t *) current_out;
        if (encrypting) {
            grasshopper_append128(currentBlock, currentInputBlock);
            grasshopper_encrypt_block(&c->encrypt_round_keys, currentBlock,
                                      currentOutputBlock, &c->buffer);
            grasshopper_copy128(currentBlock, currentOutputBlock);
        } else {
            grasshopper_w128_t tmp;

            grasshopper_copy128(&tmp, currentInputBlock);
            grasshopper_decrypt_block(&c->decrypt_round_keys,
                                      currentInputBlock, currentOutputBlock,
                                      &c->buffer);
            grasshopper_append128(currentOutputBlock, currentBlock);
            grasshopper_copy128(currentBlock, &tmp);
        }
    }

    return 1;
}